

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# owner.cpp
# Opt level: O3

string * fs_get_owner_name_abi_cxx11_(string *__return_storage_ptr__,string_view path)

{
  int iVar1;
  int *piVar2;
  passwd *ppVar3;
  string_view fname;
  statx sx;
  stat sStack_1a8;
  allocator<char> local_118 [20];
  __uid_t local_104;
  
  iVar1 = statx(0xffffff9c,path._M_str,0x800,8,local_118);
  if (((iVar1 == 0) ||
      ((piVar2 = __errno_location(), *piVar2 == 0x26 &&
       (iVar1 = stat(path._M_str,&sStack_1a8), local_104 = sStack_1a8.st_uid, iVar1 == 0)))) &&
     (ppVar3 = getpwuid(local_104), ppVar3 != (passwd *)0x0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,ppVar3->pw_name,local_118);
  }
  else {
    fname._M_str = "fs_get_owner_name";
    fname._M_len = 0x11;
    fs_print_error(path,fname);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
fs_get_owner_name(std::string_view path)
{
#if defined(_WIN32)
  if (std::string s = fs_win32_owner(path, false); !s.empty())
    return s;
#else
  if (auto uid = fs_stat_uid(path)) {
    if (auto pw = getpwuid(uid.value()))
      return pw->pw_name;
  }
#endif

  fs_print_error(path, __func__);
  return {};
}